

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O3

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::checkForDeadlock
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
  *this_00;
  unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
  *this_01;
  void *pvVar1;
  bool bVar2;
  mapped_type mVar3;
  int x;
  iterator iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  mapped_type *this_02;
  iterator iVar7;
  size_type sVar8;
  uint uVar9;
  ZEeventsChecker *pZVar10;
  ze_event_handle_t *pp_Var11;
  pointer pcVar12;
  ulong uVar13;
  uint32_t this_action_new_node_id;
  string spacePrefix;
  string fromAction;
  string toAction;
  vector<int,_std::allocator<int>_> dagIDsInPath;
  pair<std::vector<int,_std::allocator<int>_>,_bool> path;
  string action;
  ostringstream oss;
  key_type local_2cc;
  char *local_2c8;
  long local_2c0;
  undefined7 local_2b8;
  undefined4 uStack_2b1;
  undefined1 local_2ad;
  ZEeventsChecker *local_2a8;
  ze_event_handle_t local_2a0;
  char *local_298;
  long local_290;
  undefined7 local_288;
  undefined4 uStack_281;
  undefined1 local_27d;
  _ze_event_handle_t *local_278;
  char *local_270;
  long local_268;
  undefined7 local_260;
  undefined4 uStack_259;
  undefined1 local_255;
  string *local_250;
  ulong local_248;
  key_type_conflict local_23c;
  vector<int,_std::allocator<int>_> local_238;
  char *local_220;
  long local_218;
  undefined7 local_210;
  undefined4 uStack_209;
  undefined1 local_205;
  ze_event_handle_t *local_200;
  _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f8;
  ulong local_1f0;
  pair<std::vector<int,_std::allocator<int>_>,_bool> local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_2cc = 0xffffffff;
  local_2a8 = this;
  local_2a0 = hSignalEvent;
  if (hSignalEvent != (ze_event_handle_t)0x0) {
    iVar4 = std::
            _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->eventToDagID)._M_h,&local_2a0);
    if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: hSignalEvent {",0x17);
      poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"} might be an invalid event in call to ",0x27);
      pcVar12 = (zeCallDisc->_M_dataplus)._M_p;
      sVar8 = zeCallDisc->_M_string_length;
LAB_00195df0:
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,sVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      return;
    }
    validateSignalEventOwnership(this,zeCallDisc,local_2a0);
    if (*(mapped_type *)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                ._M_cur + 0x10) != 0xffffffff) {
      local_2cc = *(mapped_type *)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                          ._M_cur + 0x10);
    }
  }
  uVar13 = (ulong)numWaitEvents;
  local_250 = zeCallDisc;
  local_248 = uVar13;
  if (numWaitEvents != 0) {
    this_00 = &local_2a8->eventToDagID;
    pp_Var11 = phWaitEvents;
    do {
      iVar4 = std::
              _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,pp_Var11);
      if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: phWaitEvents {",0x17);
        poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"} might be an invalid event in call to ",0x27);
        pcVar12 = (local_250->_M_dataplus)._M_p;
        sVar8 = local_250->_M_string_length;
        goto LAB_00195df0;
      }
      pp_Var11 = pp_Var11 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  pZVar10 = local_2a8;
  local_200 = phWaitEvents;
  if (local_2cc == 0xffffffff) {
    mVar3 = xla::GraphCycles::NewNode(&local_2a8->dag);
    local_2cc = mVar3;
    pmVar5 = std::__detail::
             _Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pZVar10->eventToDagID,&local_2a0);
    *pmVar5 = mVar3;
  }
  pp_Var11 = local_200;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(local_250->_M_dataplus)._M_p,local_250->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,": (hSignalEvent{",0x10);
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}, phWaitEvents{",0x10);
  if (numWaitEvents != 0) {
    uVar13 = 0;
    do {
      std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
      if (uVar13 < numWaitEvents - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      uVar13 = uVar13 + 1;
    } while (local_248 != uVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"})",2);
  std::__cxx11::stringbuf::str();
  local_298 = (char *)&local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_1c8,local_1c0 + (long)local_1c8);
  local_278 = local_2a0;
  this_01 = &local_2a8->dagIDToAction;
  this_02 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_01,&local_2cc);
  std::__cxx11::string::operator=((string *)this_02,(string *)&local_298);
  this_02->second = local_278;
  if (local_298 != (char *)&local_288) {
    operator_delete(local_298,CONCAT17((undefined1)uStack_281,local_288) + 1);
  }
  if (numWaitEvents != 0) {
    local_1f8 = &(local_2a8->eventToDagID)._M_h;
    pZVar10 = (ZEeventsChecker *)&local_2a8->dag;
    uVar13 = 0;
    local_2a8 = pZVar10;
    do {
      local_1f0 = uVar13;
      iVar4 = std::
              _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_1f8,pp_Var11 + uVar13);
      if (iVar4.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: phWaitEvents {",0x17);
        poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"} might be an invalid event in call to ",0x27);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_250->_M_dataplus)._M_p,local_250->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        break;
      }
      x = *(int *)((long)iVar4.
                         super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                         ._M_cur + 0x10);
      if (x == -1) {
        x = xla::GraphCycles::NewNode((GraphCycles *)pZVar10);
        *(int *)((long)iVar4.
                       super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                       ._M_cur + 0x10) = x;
      }
      bVar2 = xla::GraphCycles::InsertEdge((GraphCycles *)pZVar10,x,local_2cc);
      if (!bVar2) {
        local_270 = (char *)CONCAT44(local_270._4_4_,x);
        iVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_01->_M_h,(key_type_conflict *)&local_270);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_298 = (char *)&local_288;
          local_288 = 0x4f484543414c50;
          uStack_281 = 0x5245444c;
          local_290 = 0xb;
          local_27d = 0;
        }
        else {
          local_298 = (char *)&local_288;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10),
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x18) +
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10));
        }
        local_1e8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = local_2cc;
        iVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_01->_M_h,(key_type_conflict *)&local_1e8);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_270 = (char *)&local_260;
          local_260 = 0x4f484543414c50;
          uStack_259 = 0x5245444c;
          local_268 = 0xb;
          local_255 = 0;
        }
        else {
          local_270 = (char *)&local_260;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10),
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x18) +
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: There may be a potential event deadlock!\n",0x32)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Adding the following dependency would create a cycle in the DAG:\n\tFrom: ",0x48
                  );
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_298,local_290);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tTo: ",6);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_270,local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"There is already a path:\n",0x19);
        xla::GraphCycles::PathDagIDs(&local_1e8,(GraphCycles *)pZVar10,local_2cc,x,0xf);
        std::vector<int,_std::allocator<int>_>::vector(&local_238,&local_1e8.first);
        local_220 = (char *)CONCAT44(local_220._4_4_,
                                     *local_238.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
        iVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_01->_M_h,(key_type_conflict *)&local_220);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_2c8 = (char *)&local_2b8;
          local_2b8 = 0x4f484543414c50;
          uStack_2b1 = 0x5245444c;
          local_2c0 = 0xb;
          local_2ad = 0;
        }
        else {
          local_2c8 = (char *)&local_2b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c8,
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10),
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x18) +
                     *(long *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                     ._M_cur + 0x10));
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2c8,local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if (local_2c8 != (char *)&local_2b8) {
          operator_delete(local_2c8,CONCAT17((undefined1)uStack_2b1,local_2b8) + 1);
        }
        local_2c8 = (char *)&local_2b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
        if (4 < (ulong)((long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          uVar13 = 1;
          uVar9 = 2;
          do {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_2c8,local_2c0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|\n",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,local_2c0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-> ",3);
            local_23c = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13];
            iVar7 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&this_01->_M_h,&local_23c);
            local_220 = (char *)&local_210;
            if (iVar7.
                super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              local_210 = 0x4f484543414c50;
              uStack_209 = 0x5245444c;
              local_218 = 0xb;
              local_205 = 0;
            }
            else {
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,
                         *(long *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                         ._M_cur + 0x10),
                         *(long *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                         ._M_cur + 0x18) +
                         *(long *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                         ._M_cur + 0x10));
            }
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_220,local_218);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if (local_220 != (char *)&local_210) {
              operator_delete(local_220,CONCAT17((undefined1)uStack_209,local_210) + 1);
            }
            std::__cxx11::string::append((char *)&local_2c8);
            uVar13 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar13 < (ulong)((long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_238.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 2));
        }
        if (local_1e8.second != false) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_2c8,local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|\n",2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,local_2c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-> ...\n",7);
        }
        pp_Var11 = local_200;
        pZVar10 = local_2a8;
        if (local_2c8 != (char *)&local_2b8) {
          operator_delete(local_2c8,CONCAT17((undefined1)uStack_2b1,local_2b8) + 1);
        }
        if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pvVar1 = (void *)CONCAT44(local_1e8.first.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (mapped_type)
                                  local_1e8.first.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_1e8.first.super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar1);
        }
        if (local_270 != (char *)&local_260) {
          operator_delete(local_270,CONCAT17((undefined1)uStack_259,local_260) + 1);
        }
        if (local_298 != (char *)&local_288) {
          operator_delete(local_298,CONCAT17((undefined1)uStack_281,local_288) + 1);
        }
      }
      uVar13 = local_1f0 + 1;
    } while (uVar13 != local_248);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::checkForDeadlock(
    const std::string &zeCallDisc,        /// action discription
    const ze_event_handle_t hSignalEvent, ///< [in][optional] handle of the event to forming the outgoing edge in the DAG
    const uint32_t numWaitEvents,         ///< [in][optional] number of events that point to this action.
    const ze_event_handle_t *phWaitEvents ///< [in][optional][range(0, numWaitEvents)] handle of the events that point to this action.
) {

    uint32_t this_action_new_node_id = invalidDagID;

    if (hSignalEvent != nullptr) {

        auto it = eventToDagID.find(hSignalEvent);
        // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: hSignalEvent {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }

        // A passive check to see if the user is using the same event for multiple actions.
        // It only print warnings and does not stop the event deadlock checker.
        validateSignalEventOwnership(zeCallDisc, hSignalEvent);

        if (it->second != invalidDagID) {
            // This event already exists in the DAG. Get the DAG node ID.
            // For example when there is indeed a deadlock it would have already been created.
            this_action_new_node_id = it->second;
        }
    }

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        if (eventToDagID.find(phWaitEvents[i]) == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
    }

    if (this_action_new_node_id == invalidDagID) {
        // Create node in DAG
        this_action_new_node_id = addNodeInDag();

        // Now we know where the hSignalEvent points from/out in the DAG. Update the eventToDagID map.
        eventToDagID[hSignalEvent] = this_action_new_node_id;
    }

    // Add this action to the actionToDagID map.
    std::ostringstream oss;
    oss << zeCallDisc << ": (hSignalEvent{" << hSignalEvent << "}, phWaitEvents{";

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        oss << phWaitEvents[i];
        if (i < numWaitEvents - 1) {
            oss << ", ";
        }
    }
    oss << "})";

    std::string action = oss.str(); // Convert the stream to a string.
    dagIDToAction[this_action_new_node_id] = actionAndSignalEvent(action, hSignalEvent);

    // Form the dependency in the DAG
    for (uint32_t i = 0; i < numWaitEvents; i++) {
        auto it = eventToDagID.find(phWaitEvents[i]);
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << phWaitEvents[i] << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
        uint32_t dagID = it->second;
        if (dagID == invalidDagID) {
            // Create a new node in the DAG for this wait event. That action will be created some time in the future.
            dagID = addNodeInDag();
            it->second = dagID;
        }

        auto getActionDetails = [&](int dagID) -> std::string {
            auto actionIt = dagIDToAction.find(dagID);
            return (actionIt != dagIDToAction.end()) ? actionIt->second.first : "PLACEHOLDER";
        };

        if (!addEdgeInDag(dagID, this_action_new_node_id)) {
            std::string fromAction = getActionDetails(dagID);
            std::string toAction = getActionDetails(this_action_new_node_id);

            std::cerr << "Warning: There may be a potential event deadlock!\n";
            std::cerr << "Adding the following dependency would create a cycle in the DAG:\n\tFrom: " << fromAction << "\n\tTo: " << toAction << "\n";
            std::cerr << "There is already a path:\n";

            constexpr uint32_t maxPathLength = 15;
            auto path = dag.PathDagIDs(this_action_new_node_id, dagID, maxPathLength);
            auto dagIDsInPath = path.first;
            std::cerr << getActionDetails(dagIDsInPath[0]) << "\n";
            std::string spacePrefix = "";
            for (uint32_t j = 1; j < dagIDsInPath.size(); j++) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> " << getActionDetails(dagIDsInPath[j]) << "\n";
                spacePrefix += "   ";
            }
            if (path.second) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> ...\n";
            }
        }
    }
}